

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O3

void Emb_ManCollectSuper(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSuper,Vec_Int_t *vVisit)

{
  int iVar1;
  long lVar2;
  
  vSuper->nSize = 0;
  vVisit->nSize = 0;
  if (((uint)*(ulong *)pObj >> 0x1e & 1) == 0) {
    __assert_fail("pObj->fMark0 == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                  ,0x13d,
                  "void Emb_ManCollectSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff;
  Emb_ManCollectSuper_rec(p,pObj,vSuper,vVisit);
  pObj->field_0x3 = pObj->field_0x3 | 0x40;
  if (0 < vVisit->nSize) {
    lVar2 = 0;
    do {
      iVar1 = vVisit->pArray[lVar2];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      *(ulong *)(p->pObjs + iVar1) = *(ulong *)(p->pObjs + iVar1) & 0xbfffffffffffffff;
      lVar2 = lVar2 + 1;
    } while (lVar2 < vVisit->nSize);
  }
  return;
}

Assistant:

void Emb_ManCollectSuper( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSuper, Vec_Int_t * vVisit )  
{
    int Entry, i;
    Vec_IntClear( vSuper );
    Vec_IntClear( vVisit );
    assert( pObj->fMark0 == 1 );
    pObj->fMark0 = 0;
    Emb_ManCollectSuper_rec( p, pObj, vSuper, vVisit );
    pObj->fMark0 = 1;
    Vec_IntForEachEntry( vVisit, Entry, i )
        Gia_ManObj(p, Entry)->fMark1 = 0;
}